

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxratiotester.h
# Opt level: O3

void __thiscall
soplex::
SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setDelta(SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newDelta)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int32_t iVar7;
  int iVar8;
  Real RVar9;
  cpp_dec_float<50U,_int,_void> local_58;
  
  pTVar1 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar9 = Tolerances::epsilon(pTVar1);
  bVar3 = false;
  if ((!NAN(RVar9)) && (bVar3 = false, (newDelta->m_backend).fpclass != cpp_dec_float_NaN)) {
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,RVar9);
    iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&newDelta->m_backend,&local_58);
    bVar3 = iVar8 < 1;
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (bVar3) {
    pTVar1 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    RVar9 = Tolerances::epsilon(pTVar1);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&this->delta,RVar9);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  else {
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 8) =
         *(undefined8 *)((newDelta->m_backend).data._M_elems + 8);
    uVar4 = *(undefined8 *)(newDelta->m_backend).data._M_elems;
    uVar5 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 2);
    uVar6 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 6);
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 4) =
         *(undefined8 *)((newDelta->m_backend).data._M_elems + 4);
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 6) = uVar6;
    *(undefined8 *)(this->delta).m_backend.data._M_elems = uVar4;
    *(undefined8 *)((this->delta).m_backend.data._M_elems + 2) = uVar5;
    (this->delta).m_backend.exp = (newDelta->m_backend).exp;
    (this->delta).m_backend.neg = (newDelta->m_backend).neg;
    iVar7 = (newDelta->m_backend).prec_elem;
    (this->delta).m_backend.fpclass = (newDelta->m_backend).fpclass;
    (this->delta).m_backend.prec_elem = iVar7;
  }
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         delta = this->tolerances()->epsilon();
      else
         delta = newDelta;
   }